

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

void nn_sws_term(nn_sws *self)

{
  int iVar1;
  msg_chunk *it;
  nn_list *self_00;
  
  self_00 = (nn_list *)(ulong)(uint)self->state;
  if (self->state == 1) {
    nn_fsm_event_term(&self->done);
    nn_msg_term(&self->outmsg);
    nn_msg_array_term(&self->inmsg_array);
    nn_pipebase_term(&self->pipebase);
    nn_ws_handshake_term(&self->handshaker);
    nn_fsm_term(&self->fsm);
    return;
  }
  nn_sws_term_cold_1();
  while( true ) {
    iVar1 = nn_list_empty(self_00);
    if (iVar1 != 0) break;
    it = (msg_chunk *)nn_list_begin(self_00);
    nn_msg_chunk_term(it,self_00);
  }
  nn_list_term(self_00);
  return;
}

Assistant:

void nn_sws_term (struct nn_sws *self)
{
    nn_assert_state (self, NN_SWS_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_msg_term (&self->outmsg);
    nn_msg_array_term (&self->inmsg_array);
    nn_pipebase_term (&self->pipebase);
    nn_ws_handshake_term (&self->handshaker);
    nn_fsm_term (&self->fsm);
}